

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::constant_name(string *__return_storage_ptr__,t_dart_generator *this,string *name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  reference pcVar7;
  bool is_upper;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  char character;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  bool was_previous_char_upper;
  bool is_first;
  string *name_local;
  t_dart_generator *this_local;
  string *constant_name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = true;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_40._M_current = (char *)std::__cxx11::string::end();
  bVar3 = false;
  while (bVar4 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc0), bVar4) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar7;
    iVar5 = isupper((int)cVar1);
    if (((iVar5 != 0) && (!bVar2)) && (!bVar3)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
    }
    iVar6 = toupper((int)cVar1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar6);
    bVar2 = false;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
    bVar3 = iVar5 != 0;
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::constant_name(string name) {
  string constant_name;

  bool is_first = true;
  bool was_previous_char_upper = false;
  for (char character : name) {
    bool is_upper = isupper(character);

    if (is_upper && !is_first && !was_previous_char_upper) {
      constant_name += '_';
    }
    constant_name += toupper(character);

    is_first = false;
    was_previous_char_upper = is_upper;
  }

  return constant_name;
}